

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Attr_Decl_AST_Node::eval_internal(Attr_Decl_AST_Node *this,Dispatch_State *t_ss)

{
  bool bVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Dispatch_Engine *in_RDI;
  Boxed_Value BVar3;
  reserved_word_error *anon_var_1;
  name_conflict_error *e;
  string attr_name;
  string class_name;
  int class_offset;
  const_iterator itr;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  *d;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  *in_stack_fffffffffffffda8;
  string *in_stack_fffffffffffffdb0;
  Proxy_Function *in_stack_fffffffffffffdb8;
  Dispatch_Engine *this_00;
  Dispatch_Engine *__args_1;
  Type_Conversions_State *in_stack_fffffffffffffeb0;
  Boxed_Value *in_stack_fffffffffffffeb8;
  string local_130 [64];
  undefined1 local_f0 [48];
  _Self local_c0;
  string local_b8 [32];
  _Self local_98;
  int local_90;
  allocator local_79;
  string local_78 [32];
  _Self local_58;
  undefined1 local_50 [48];
  atomic_uint_fast32_t local_20;
  
  __args_1 = in_RDI;
  chaiscript::detail::Dispatch_State::operator->((Dispatch_State *)0x220096);
  chaiscript::detail::Dispatch_Engine::get_parent_locals_abi_cxx11_(in_RDI);
  local_20.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"_current_class_name",&local_79);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
       ::find(in_stack_fffffffffffffda8,(key_type *)0x220104);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  local_98._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
       ::end(in_stack_fffffffffffffda8);
  bVar1 = std::operator!=(&local_58,&local_98);
  local_90 = 0;
  if (bVar1) {
    local_90 = -1;
  }
  local_c0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
       ::end(in_stack_fffffffffffffda8);
  bVar1 = std::operator!=(&local_58,&local_c0);
  if (bVar1) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
                  *)0x2201af);
    boxed_cast<std::__cxx11::string>(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  }
  else {
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)(in_RSI + 3),0);
    peVar2 = std::
             __shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2201e5);
    std::__cxx11::string::string(local_b8,(string *)&peVar2->text);
  }
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                *)(in_RSI + 3),(long)(local_90 + 1));
  peVar2 = std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x22021f);
  std::__cxx11::string::string((string *)(local_f0 + 0x10),(string *)&peVar2->text);
  chaiscript::detail::Dispatch_State::operator->((Dispatch_State *)0x220242);
  std::__cxx11::string::string(local_130,(string *)(local_f0 + 0x10));
  fun<chaiscript::eval::Attr_Decl_AST_Node::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(chaiscript::dispatch::Dynamic_Object&)_1_>
            ((anon_class_32_1_15d86eb9_for_m_f *)in_stack_fffffffffffffda8);
  std::
  make_shared<chaiscript::dispatch::detail::Dynamic_Object_Function,std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,bool>
            (in_RSI,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)__args_1,(bool *)in_RDI
            );
  this_00 = (Dispatch_Engine *)local_f0;
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::
  shared_ptr<chaiscript::dispatch::detail::Dynamic_Object_Function,void>
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)in_stack_fffffffffffffdb0,
             (shared_ptr<chaiscript::dispatch::detail::Dynamic_Object_Function> *)
             in_stack_fffffffffffffda8);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                *)(in_RSI + 3),(long)(local_90 + 1));
  std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2202e0);
  chaiscript::detail::Dispatch_Engine::add
            (this_00,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x220305);
  std::shared_ptr<chaiscript::dispatch::detail::Dynamic_Object_Function>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::detail::Dynamic_Object_Function> *)0x220312);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x22031f);
  const::{lambda(chaiscript::dispatch::Dynamic_Object&)#1}::~Dynamic_Object
            ((anon_class_32_1_15d86eb9_for_m_f *)0x22032c);
  std::__cxx11::string::~string((string *)(local_f0 + 0x10));
  Boxed_Value::Boxed_Value((Boxed_Value *)0x2206fb);
  std::__cxx11::string::~string(local_b8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
          *)0x220717);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)__args_1;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE 
        {
          const auto &d = t_ss->get_parent_locals();
          const auto itr = d.find("_current_class_name");
          const auto class_offset = (itr != d.end())?-1:0;
          std::string class_name = (itr != d.end())?std::string(boxed_cast<std::string>(itr->second)):this->children[0]->text;

          try {
            std::string attr_name = this->children[static_cast<size_t>(1 + class_offset)]->text;

            t_ss->add(
                std::make_shared<dispatch::detail::Dynamic_Object_Function>(
                     std::move(class_name),
                     fun([attr_name](dispatch::Dynamic_Object &t_obj) {
                           return t_obj.get_attr(attr_name);
                         }),
                     true

                ), this->children[static_cast<size_t>(1 + class_offset)]->text);

          }
          catch (const exception::reserved_word_error &) {
            throw exception::eval_error("Reserved word used as attribute '" + this->children[static_cast<size_t>(1 + class_offset)]->text + "'");
          } catch (const exception::name_conflict_error &e) {
            throw exception::eval_error("Attribute redefined '" + e.name() + "'");
          }
          return Boxed_Value();
        }